

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

iterator __thiscall
tf::SmallVectorImpl<tf::Node*>::insert<tf::Node**>
          (SmallVectorImpl<tf::Node*> *this,iterator I,Node **From,Node **To)

{
  ulong uVar1;
  long lVar2;
  size_t __n;
  size_t __n_00;
  ulong uVar3;
  move_iterator<tf::Node_**> in_end;
  iterator ppNVar4;
  long lVar5;
  
  lVar2 = *(long *)this;
  in_end._M_current = *(Node ***)(this + 8);
  if (in_end._M_current == I) {
    append<tf::Node**>(this,From,To);
    ppNVar4 = (iterator)((long)I + (*(long *)this - lVar2));
  }
  else {
    __n = (long)To - (long)From;
    uVar3 = (long)__n >> 3;
    uVar1 = ((long)in_end._M_current - lVar2 >> 3) + uVar3;
    lVar5 = lVar2;
    if ((ulong)(*(long *)(this + 0x10) - lVar2 >> 3) < uVar1) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x18,uVar1 * 8,8);
      lVar5 = *(long *)this;
      in_end._M_current = *(Node ***)(this + 8);
    }
    ppNVar4 = (iterator)((long)I + (lVar5 - lVar2));
    uVar1 = (long)in_end._M_current - (long)ppNVar4 >> 3;
    if (uVar1 < uVar3) {
      *(size_t *)(this + 8) = __n + (long)in_end._M_current;
      if (ppNVar4 != in_end._M_current) {
        memcpy((void *)(__n + (long)in_end._M_current + uVar1 * -8),ppNVar4,
               (long)in_end._M_current - (long)ppNVar4);
        lVar2 = 0;
        uVar3 = 0;
        do {
          ppNVar4[uVar3] = From[uVar3];
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + -8;
        } while (uVar1 != uVar3);
        From = (Node **)((long)From - lVar2);
      }
      if (From != To) {
        memcpy(in_end._M_current,From,(long)To - (long)From);
      }
    }
    else {
      append<std::move_iterator<tf::Node**>>
                (this,(move_iterator<tf::Node_**>)(in_end._M_current + -uVar3),in_end);
      __n_00 = (long)(in_end._M_current + -uVar3) - (long)ppNVar4;
      if (__n_00 != 0) {
        memmove((void *)((long)in_end._M_current - __n_00),ppNVar4,__n_00);
      }
      if (To != From) {
        ppNVar4 = (iterator)memmove(ppNVar4,From,__n);
        return ppNVar4;
      }
    }
  }
  return ppNVar4;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    //assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    //assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->setEnd(this->end() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }